

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O3

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_> *this,void **vtt)

{
  double *pdVar1;
  void *pvVar2;
  
  TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
            (&this->super_TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>,vtt + 1);
  pvVar2 = *vtt;
  *(void **)&(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>).
             super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>.super_TPZGeoEl = pvVar2;
  *(void **)(&(((TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *)
               (&(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>).
                 super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>.fGeo + -2))->super_TPZGeoEl).
              field_0x0 + *(long *)((long)pvVar2 + -0x60)) = vtt[7];
  pdVar1 = (this->fCornerCo).fBuf;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01883a30;
  (this->fCornerCo).super_TPZFMatrix<double>.fElem = pdVar1;
  (this->fCornerCo).super_TPZFMatrix<double>.fGiven = pdVar1;
  (this->fCornerCo).super_TPZFMatrix<double>.fSize = 6;
  TPZVec<int>::TPZVec(&(this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
       (this->fCornerCo).super_TPZFMatrix<double>.fPivot.fExtAlloc;
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_01813df0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork.fNElements = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork.fNAlloc = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01883740;
  TPZFMatrix<double>::operator=(&(this->fCornerCo).super_TPZFMatrix<double>,0.0);
  return;
}

Assistant:

TPZGeoElMapped() : TPZRegisterClassId(&TPZGeoElMapped::ClassId),
    TBase(), fCornerCo(Geo::Dimension,Geo::NNodes,0.)
	{
	}